

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occludedCoherent(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  AccelData *pAVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  ulong uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  uint uVar42;
  undefined4 uVar43;
  uint uVar44;
  ulong *puVar45;
  ulong uVar46;
  RayQueryContext *pRVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  long lVar53;
  ulong *puVar54;
  ulong uVar55;
  ulong uVar56;
  bool bVar57;
  undefined1 auVar58 [16];
  vint4 ai;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  vint4 ai_1;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  vint4 ai_3;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  vint4 bi;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [64];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  vint4 bi_3;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM10 [64];
  vint4 ai_2;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  vint4 bi_2;
  undefined1 auVar100 [16];
  float fVar103;
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  vint<4> octant;
  StackItemMaskT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_27d8 [8];
  float fStack_27d0;
  float fStack_27cc;
  undefined1 local_2778 [16];
  float local_26e8;
  float fStack_26e4;
  float fStack_26e0;
  float fStack_26dc;
  undefined1 local_26d8 [16];
  undefined1 local_26c8 [16];
  anon_union_16_2_9473010e_for_vint_impl<4>_1 local_26b8;
  undefined4 local_26a8;
  undefined4 uStack_26a4;
  undefined4 uStack_26a0;
  undefined4 uStack_269c;
  undefined1 local_2698 [16];
  float local_2688;
  float fStack_2684;
  float fStack_2680;
  float fStack_267c;
  float local_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float local_2668;
  float fStack_2664;
  float fStack_2660;
  float fStack_265c;
  undefined8 local_2658;
  undefined8 uStack_2650;
  undefined8 local_2648;
  undefined8 uStack_2640;
  undefined1 local_2638 [16];
  undefined1 local_2628 [16];
  undefined4 local_2618;
  undefined4 uStack_2614;
  undefined4 uStack_2610;
  undefined4 uStack_260c;
  undefined1 local_2608 [16];
  undefined1 local_25f8 [16];
  undefined1 local_25e8 [16];
  undefined8 local_25d8;
  undefined8 uStack_25d0;
  undefined8 local_25c8;
  undefined8 uStack_25c0;
  undefined8 local_25b8;
  undefined8 uStack_25b0;
  undefined8 local_25a8;
  undefined8 uStack_25a0;
  undefined8 local_2598;
  undefined8 uStack_2590;
  undefined8 local_2588;
  undefined8 uStack_2580;
  undefined1 local_2578 [16];
  undefined1 local_2568 [16];
  undefined4 local_2558;
  undefined4 uStack_2554;
  undefined4 uStack_2550;
  undefined4 uStack_254c;
  undefined4 uStack_2548;
  undefined4 uStack_2544;
  undefined4 uStack_2540;
  undefined4 uStack_253c;
  uint local_2538;
  uint uStack_2534;
  uint uStack_2530;
  uint uStack_252c;
  uint uStack_2528;
  uint uStack_2524;
  uint uStack_2520;
  uint uStack_251c;
  float local_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  undefined8 uStack_2508;
  undefined8 uStack_2500;
  float local_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float fStack_24e0;
  float fStack_24dc;
  float local_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float fStack_24c0;
  float fStack_24bc;
  undefined4 local_24b8;
  undefined4 uStack_24b4;
  undefined4 uStack_24b0;
  undefined4 uStack_24ac;
  undefined4 uStack_24a8;
  undefined4 uStack_24a4;
  undefined4 uStack_24a0;
  undefined4 uStack_249c;
  undefined4 local_2498;
  undefined4 uStack_2494;
  undefined4 uStack_2490;
  undefined4 uStack_248c;
  undefined4 uStack_2488;
  undefined4 uStack_2484;
  undefined4 uStack_2480;
  undefined4 uStack_247c;
  uint local_2478;
  uint uStack_2474;
  uint uStack_2470;
  uint uStack_246c;
  uint uStack_2468;
  uint uStack_2464;
  uint uStack_2460;
  uint uStack_245c;
  undefined8 local_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 uStack_2440;
  uint local_2438;
  uint uStack_2434;
  uint uStack_2430;
  uint uStack_242c;
  uint uStack_2428;
  uint uStack_2424;
  uint uStack_2420;
  uint uStack_241c;
  undefined8 local_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 uStack_2400;
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  float local_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  float fStack_23c0;
  float fStack_23bc;
  uint local_23b8;
  uint uStack_23b4;
  uint uStack_23b0;
  uint uStack_23ac;
  uint uStack_23a8;
  uint uStack_23a4;
  uint uStack_23a0;
  uint uStack_239c;
  undefined1 local_2398 [32];
  ulong local_2378 [1129];
  vint4 bi_8;
  
  local_26b8 = valid_i->field_0;
  auVar58 = vpcmpeqd_avx(in_ZMM10._0_16_,in_ZMM10._0_16_);
  auVar104 = vpcmpeqd_avx(auVar58,(undefined1  [16])local_26b8);
  uVar42 = vmovmskps_avx(auVar104);
  if (uVar42 == 0) {
    return;
  }
  pAVar5 = This->ptr;
  uVar51 = (ulong)(uVar42 & 0xff);
  auVar39 = *(undefined1 (*) [16])ray;
  local_2678 = *(float *)(ray + 0x10);
  auVar40 = *(undefined1 (*) [16])(ray + 0x10);
  local_2688 = *(float *)(ray + 0x20);
  auVar41 = *(undefined1 (*) [16])(ray + 0x20);
  auVar105 = *(undefined1 (*) [16])(ray + 0x40);
  local_26c8._8_4_ = 0x7fffffff;
  local_26c8._0_8_ = 0x7fffffff7fffffff;
  local_26c8._12_4_ = 0x7fffffff;
  auVar86 = vandps_avx(local_26c8,auVar105);
  auVar85._8_4_ = 0x219392ef;
  auVar85._0_8_ = 0x219392ef219392ef;
  auVar85._12_4_ = 0x219392ef;
  auVar86 = vcmpps_avx(auVar86,auVar85,1);
  auVar6 = vblendvps_avx(auVar105,auVar85,auVar86);
  auVar86 = *(undefined1 (*) [16])(ray + 0x50);
  auVar76 = vandps_avx(local_26c8,auVar86);
  auVar76 = vcmpps_avx(auVar76,auVar85,1);
  auVar7 = vblendvps_avx(auVar86,auVar85,auVar76);
  auVar76 = *(undefined1 (*) [16])(ray + 0x60);
  auVar74 = vandps_avx(local_26c8,auVar76);
  auVar74 = vcmpps_avx(auVar74,auVar85,1);
  auVar74 = vblendvps_avx(auVar76,auVar85,auVar74);
  auVar85 = vrcpps_avx(auVar6);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = 0x3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar85,auVar93);
  auVar85 = vfmadd132ps_fma(auVar6,auVar85,auVar85);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar93);
  auVar7 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar74);
  auVar74 = vfnmadd213ps_fma(auVar74,auVar6,auVar93);
  auVar6 = vfmadd132ps_fma(auVar74,auVar6,auVar6);
  auVar93 = ZEXT816(0);
  auVar74 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar93);
  local_2698 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar93);
  auVar89 = ZEXT1664(auVar58 ^ auVar104);
  auVar105 = vcmpps_avx(auVar105,auVar93,1);
  auVar59._8_4_ = 1;
  auVar59._0_8_ = 0x100000001;
  auVar59._12_4_ = 1;
  auVar105 = vandps_avx(auVar105,auVar59);
  auVar86 = vcmpps_avx(auVar86,auVar93,1);
  auVar75._8_4_ = 2;
  auVar75._0_8_ = 0x200000002;
  auVar75._12_4_ = 2;
  auVar86 = vandps_avx(auVar86,auVar75);
  auVar86 = vorps_avx(auVar86,auVar105);
  auVar105 = vcmpps_avx(auVar76,auVar93,1);
  auVar76._8_4_ = 4;
  auVar76._0_8_ = 0x400000004;
  auVar76._12_4_ = 4;
  auVar105 = vandps_avx(auVar105,auVar76);
  auVar58 = vpor_avx(auVar58 ^ auVar104,auVar105);
  local_26d8 = vpor_avx(auVar58,auVar86);
  local_2668 = *(float *)ray;
  fStack_2664 = *(float *)(ray + 4);
  fStack_2660 = *(float *)(ray + 8);
  fStack_265c = *(float *)(ray + 0xc);
  auVar104._0_4_ = auVar85._0_4_ * -*(float *)ray;
  auVar104._4_4_ = auVar85._4_4_ * -*(float *)(ray + 4);
  auVar104._8_4_ = auVar85._8_4_ * -*(float *)(ray + 8);
  auVar104._12_4_ = auVar85._12_4_ * -*(float *)(ray + 0xc);
  fStack_2674 = *(float *)(ray + 0x14);
  fStack_2670 = *(float *)(ray + 0x18);
  fStack_266c = *(float *)(ray + 0x1c);
  auVar105._0_4_ = auVar7._0_4_ * -local_2678;
  auVar105._4_4_ = auVar7._4_4_ * -*(float *)(ray + 0x14);
  auVar105._8_4_ = auVar7._8_4_ * -*(float *)(ray + 0x18);
  auVar105._12_4_ = auVar7._12_4_ * -*(float *)(ray + 0x1c);
  fStack_2684 = *(float *)(ray + 0x24);
  fStack_2680 = *(float *)(ray + 0x28);
  fStack_267c = *(float *)(ray + 0x2c);
  local_2618 = 0x80000000;
  uStack_2614 = 0x80000000;
  uStack_2610 = 0x80000000;
  uStack_260c = 0x80000000;
  auVar58._0_4_ = auVar6._0_4_ * -local_2688;
  auVar58._4_4_ = auVar6._4_4_ * -*(float *)(ray + 0x24);
  auVar58._8_4_ = auVar6._8_4_ * -*(float *)(ray + 0x28);
  auVar58._12_4_ = auVar6._12_4_ * -*(float *)(ray + 0x2c);
  local_24b8 = 0x80000000;
  uStack_24b4 = 0x80000000;
  uStack_24b0 = 0x80000000;
  uStack_24ac = 0x80000000;
  uStack_24a8 = 0x80000000;
  uStack_24a4 = 0x80000000;
  uStack_24a0 = 0x80000000;
  uStack_249c = 0x80000000;
  local_26a8 = 0x7f800000;
  uStack_26a4 = 0x7f800000;
  uStack_26a0 = 0x7f800000;
  uStack_269c = 0x7f800000;
  pRVar47 = context;
LAB_005c0254:
  auVar86 = auVar89._0_16_;
  lVar53 = 0;
  for (uVar50 = uVar51; (uVar50 & 1) == 0; uVar50 = uVar50 >> 1 | 0x8000000000000000) {
    lVar53 = lVar53 + 1;
  }
  uVar43 = *(undefined4 *)(local_26d8 + lVar53 * 4);
  auVar60._4_4_ = uVar43;
  auVar60._0_4_ = uVar43;
  auVar60._8_4_ = uVar43;
  auVar60._12_4_ = uVar43;
  auVar76 = vpcmpeqd_avx(auVar60,local_26d8);
  uVar43 = vmovmskps_avx(auVar76);
  local_2378[1] = CONCAT44((int)((ulong)lVar53 >> 0x20),uVar43);
  auVar100._8_4_ = 0x7f800000;
  auVar100._0_8_ = 0x7f8000007f800000;
  auVar100._12_4_ = 0x7f800000;
  auVar59 = vblendvps_avx(auVar100,auVar39,auVar76);
  uVar51 = ~local_2378[1] & uVar51;
  auVar75 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar75,auVar59);
  auVar75 = vshufpd_avx(auVar59,auVar59,1);
  auVar75 = vminps_avx(auVar75,auVar59);
  auVar59 = vblendvps_avx(auVar100,auVar40,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar75 = vinsertps_avx(auVar75,auVar59,0x1c);
  auVar59 = vblendvps_avx(auVar100,auVar41,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar93 = vminps_avx(auVar93,auVar59);
  auVar97._8_4_ = 0xff800000;
  auVar97._0_8_ = 0xff800000ff800000;
  auVar97._12_4_ = 0xff800000;
  auVar59 = vblendvps_avx(auVar97,auVar39,auVar76);
  auVar60 = vinsertps_avx(auVar75,auVar93,0x20);
  auVar75 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar75,auVar59);
  auVar75 = vshufpd_avx(auVar59,auVar59,1);
  auVar75 = vmaxps_avx(auVar75,auVar59);
  auVar59 = vblendvps_avx(auVar97,auVar40,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar75 = vinsertps_avx(auVar75,auVar59,0x1c);
  auVar59 = vblendvps_avx(auVar97,auVar41,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar93 = vmaxps_avx(auVar93,auVar59);
  auVar59 = vblendvps_avx(auVar100,auVar85,auVar76);
  auVar8 = vinsertps_avx(auVar75,auVar93,0x20);
  auVar75 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar75,auVar59);
  auVar75 = vshufpd_avx(auVar59,auVar59,1);
  auVar75 = vminps_avx(auVar75,auVar59);
  auVar59 = vblendvps_avx(auVar100,auVar7,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar75 = vinsertps_avx(auVar75,auVar59,0x1c);
  auVar59 = vblendvps_avx(auVar100,auVar6,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vminps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar93 = vminps_avx(auVar93,auVar59);
  auVar59 = vblendvps_avx(auVar97,auVar85,auVar76);
  auVar9 = vinsertps_avx(auVar75,auVar93,0x20);
  auVar75 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar75,auVar59);
  auVar75 = vshufpd_avx(auVar59,auVar59,1);
  auVar75 = vmaxps_avx(auVar75,auVar59);
  auVar59 = vblendvps_avx(auVar97,auVar7,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar75 = vinsertps_avx(auVar75,auVar59,0x1c);
  auVar59 = vblendvps_avx(auVar97,auVar6,auVar76);
  auVar93 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar59 = vmaxps_avx(auVar93,auVar59);
  auVar93 = vshufpd_avx(auVar59,auVar59,1);
  auVar93 = vmaxps_avx(auVar93,auVar59);
  auVar59 = vblendvps_avx(auVar100,auVar74,auVar76);
  auVar61 = vinsertps_avx(auVar75,auVar93,0x20);
  auVar75 = vshufps_avx(auVar59,auVar59,0xb1);
  auVar100 = vminps_avx(auVar75,auVar59);
  auVar62 = vshufpd_avx(auVar100,auVar100,1);
  local_2778 = vblendvps_avx(auVar97,local_2698,auVar76);
  auVar90 = vshufps_avx(local_2778,local_2778,0xb1);
  auVar93 = vcmpps_avx(auVar9,ZEXT816(0) << 0x40,5);
  auVar59 = vblendvps_avx(auVar61,auVar9,auVar93);
  auVar75 = vblendvps_avx(auVar60,auVar8,auVar93);
  local_2518 = auVar75._0_4_;
  fStack_2514 = auVar75._4_4_;
  fStack_2510 = auVar75._8_4_;
  fStack_250c = auVar75._12_4_;
  auVar90 = vmaxps_avx(auVar90,local_2778);
  auVar75 = vblendvps_avx(auVar8,auVar60,auVar93);
  local_24d8 = auVar59._0_4_;
  auVar8 = vmovshdup_avx(auVar59);
  uVar55 = (ulong)(auVar8._0_4_ < 0.0) << 5 | 0x40;
  auVar60 = vshufpd_avx(auVar59,auVar59,1);
  auVar97 = vshufpd_avx(auVar90,auVar90,1);
  uVar56 = (ulong)(auVar60._0_4_ < 0.0) << 5 | 0x80;
  auVar60 = vminps_avx(auVar62,auVar100);
  local_2558 = auVar60._0_4_;
  auVar60 = vmaxps_avx(auVar97,auVar90);
  auVar93 = vblendvps_avx(auVar9,auVar61,auVar93);
  auVar61._0_4_ = local_24d8 * local_2518;
  auVar61._4_4_ = auVar59._4_4_ * fStack_2514;
  auVar61._8_4_ = auVar59._8_4_ * fStack_2510;
  auVar61._12_4_ = auVar59._12_4_ * fStack_250c;
  local_23d8 = auVar93._0_4_;
  auVar90._0_4_ = auVar75._0_4_ * local_23d8;
  auVar90._4_4_ = auVar75._4_4_ * auVar93._4_4_;
  auVar90._8_4_ = auVar75._8_4_ * auVar93._8_4_;
  auVar90._12_4_ = auVar75._12_4_ * auVar93._12_4_;
  uVar50 = (ulong)(local_24d8 < 0.0) * 0x20;
  local_2378[0] = *(ulong *)&pAVar5[1].bounds.bounds0.lower.field_0;
  fStack_24d4 = local_24d8;
  fStack_24d0 = local_24d8;
  fStack_24cc = local_24d8;
  fStack_24c8 = local_24d8;
  fStack_24c4 = local_24d8;
  fStack_24c0 = local_24d8;
  fStack_24bc = local_24d8;
  local_24f8 = -auVar61._0_4_;
  fStack_24f4 = -auVar61._0_4_;
  fStack_24f0 = -auVar61._0_4_;
  fStack_24ec = -auVar61._0_4_;
  fStack_24e8 = -auVar61._0_4_;
  fStack_24e4 = -auVar61._0_4_;
  fStack_24e0 = -auVar61._0_4_;
  fStack_24dc = -auVar61._0_4_;
  uStack_2508 = auVar8._0_8_;
  fStack_2514 = auVar8._4_4_;
  uStack_2500 = uStack_2508;
  auVar75 = vmovshdup_avx(auVar61);
  uVar42 = auVar75._0_4_;
  uVar16 = auVar75._4_4_;
  local_2538 = uVar42 ^ 0x80000000;
  uStack_2534 = uVar16 ^ 0x80000000;
  uStack_2530 = uVar42 ^ 0x80000000;
  uStack_252c = uVar16 ^ 0x80000000;
  uStack_2528 = uVar42 ^ 0x80000000;
  uStack_2524 = uVar16 ^ 0x80000000;
  uStack_2520 = uVar42 ^ 0x80000000;
  uStack_251c = uVar16 ^ 0x80000000;
  auVar89 = ZEXT1664(auVar86);
  auVar59 = vshufps_avx(auVar59,auVar59,0xaa);
  local_2398._0_8_ = auVar59._0_8_;
  local_2398._8_8_ = local_2398._0_8_;
  local_2398._16_8_ = local_2398._0_8_;
  local_2398._24_8_ = local_2398._0_8_;
  auVar9 = vshufps_avx(auVar61,auVar61,0xaa);
  uVar13 = auVar9._0_4_;
  uVar17 = auVar9._4_4_;
  local_23b8 = uVar13 ^ 0x80000000;
  uStack_23b4 = uVar17 ^ 0x80000000;
  uStack_23b0 = uVar13 ^ 0x80000000;
  uStack_23ac = uVar17 ^ 0x80000000;
  uStack_23a8 = uVar13 ^ 0x80000000;
  uStack_23a4 = uVar17 ^ 0x80000000;
  uStack_23a0 = uVar13 ^ 0x80000000;
  uStack_239c = uVar17 ^ 0x80000000;
  fStack_23d4 = local_23d8;
  fStack_23d0 = local_23d8;
  fStack_23cc = local_23d8;
  fStack_23c8 = local_23d8;
  fStack_23c4 = local_23d8;
  fStack_23c0 = local_23d8;
  fStack_23bc = local_23d8;
  local_23f8 = -auVar90._0_4_;
  fStack_23f4 = -auVar90._0_4_;
  fStack_23f0 = -auVar90._0_4_;
  fStack_23ec = -auVar90._0_4_;
  fStack_23e8 = -auVar90._0_4_;
  fStack_23e4 = -auVar90._0_4_;
  fStack_23e0 = -auVar90._0_4_;
  fStack_23dc = -auVar90._0_4_;
  auVar59 = vmovshdup_avx(auVar93);
  local_2418 = auVar59._0_8_;
  uStack_2410 = local_2418;
  uStack_2408 = local_2418;
  uStack_2400 = local_2418;
  auVar59 = vmovshdup_avx(auVar90);
  uVar14 = auVar59._0_4_;
  uVar18 = auVar59._4_4_;
  local_2438 = uVar14 ^ 0x80000000;
  uStack_2434 = uVar18 ^ 0x80000000;
  uStack_2430 = uVar14 ^ 0x80000000;
  uStack_242c = uVar18 ^ 0x80000000;
  uStack_2428 = uVar14 ^ 0x80000000;
  uStack_2424 = uVar18 ^ 0x80000000;
  uStack_2420 = uVar14 ^ 0x80000000;
  uStack_241c = uVar18 ^ 0x80000000;
  auVar93 = vshufps_avx(auVar93,auVar93,0xaa);
  local_2458 = auVar93._0_8_;
  uStack_2450 = local_2458;
  uStack_2448 = local_2458;
  uStack_2440 = local_2458;
  auVar93 = vshufps_avx(auVar90,auVar90,0xaa);
  uVar15 = auVar93._0_4_;
  uVar19 = auVar93._4_4_;
  local_2478 = uVar15 ^ 0x80000000;
  uStack_2474 = uVar19 ^ 0x80000000;
  uStack_2470 = uVar15 ^ 0x80000000;
  uStack_246c = uVar19 ^ 0x80000000;
  uStack_2468 = uVar15 ^ 0x80000000;
  uStack_2464 = uVar19 ^ 0x80000000;
  uStack_2460 = uVar15 ^ 0x80000000;
  uStack_245c = uVar19 ^ 0x80000000;
  uStack_2554 = local_2558;
  uStack_2550 = local_2558;
  uStack_254c = local_2558;
  uStack_2548 = local_2558;
  uStack_2544 = local_2558;
  uStack_2540 = local_2558;
  uStack_253c = local_2558;
  local_2498 = auVar60._0_4_;
  uStack_2494 = local_2498;
  uStack_2490 = local_2498;
  uStack_248c = local_2498;
  uStack_2488 = local_2498;
  uStack_2484 = local_2498;
  uStack_2480 = local_2498;
  uStack_247c = local_2498;
  uVar43 = vmovmskps_avx(auVar86);
  pRVar47 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar43);
  auVar86._8_4_ = 0x7f800000;
  auVar86._0_8_ = 0x7f8000007f800000;
  auVar86._12_4_ = 0x7f800000;
  auVar86 = vblendvps_avx(auVar86,auVar74,auVar76);
  puVar45 = local_2378 + 2;
LAB_005c0658:
  pRVar47 = (RayQueryContext *)~(ulong)pRVar47;
  auVar60 = auVar89._0_16_;
  while (puVar54 = puVar45 + -2, (puVar45[-1] & (ulong)pRVar47) != 0) {
    uVar52 = *puVar54;
    uVar46 = uVar52;
    if ((uVar52 & 8) != 0) {
LAB_005c0886:
      uVar46 = (ulong)((uint)uVar52 & 0xf);
      auVar72 = auVar89._0_16_;
      auVar100 = auVar72;
      if (uVar46 == 8) goto LAB_005c0ca6;
      auVar81._0_8_ = auVar89._0_8_ ^ 0xffffffffffffffff;
      auVar81._8_4_ = auVar89._8_4_ ^ 0xffffffff;
      auVar81._12_4_ = auVar89._12_4_ ^ 0xffffffff;
      local_2588 = *(undefined8 *)ray;
      uStack_2580 = *(undefined8 *)(ray + 8);
      local_2598 = *(undefined8 *)(ray + 0x10);
      uStack_2590 = *(undefined8 *)(ray + 0x18);
      local_25a8 = *(undefined8 *)(ray + 0x20);
      uStack_25a0 = *(undefined8 *)(ray + 0x28);
      uVar24 = *(undefined8 *)(ray + 0x30);
      uVar25 = *(undefined8 *)(ray + 0x38);
      local_2648 = uVar24;
      uStack_2640 = uVar25;
      uVar26 = *(undefined8 *)(ray + 0x50);
      local_26e8 = (float)uVar26;
      fStack_26e4 = (float)((ulong)uVar26 >> 0x20);
      fStack_26e0 = (float)*(undefined8 *)(ray + 0x58);
      fStack_26dc = (float)((ulong)*(undefined8 *)(ray + 0x58) >> 0x20);
      local_25b8 = *(undefined8 *)(ray + 0x60);
      uStack_25b0 = *(undefined8 *)(ray + 0x68);
      local_25c8 = *(undefined8 *)(ray + 0x40);
      uStack_25c0 = *(undefined8 *)(ray + 0x48);
      auVar62 = *(undefined1 (*) [16])(ray + 0x40);
      uVar26 = *(undefined8 *)(ray + 0x80);
      uVar27 = *(undefined8 *)(ray + 0x88);
      local_2658 = uVar26;
      uStack_2650 = uVar27;
      local_25d8 = *(undefined8 *)(ray + 0x90);
      uStack_25d0 = *(undefined8 *)(ray + 0x98);
      lVar53 = (uVar52 & 0xfffffffffffffff0) + 0x90;
      uVar52 = 0;
      goto LAB_005c0938;
    }
    while( true ) {
      uVar52 = CONCAT44(auVar61._0_4_,auVar61._0_4_);
      auVar29._8_4_ = -auVar61._0_4_;
      auVar29._0_8_ = uVar52 ^ 0x8000000080000000;
      auVar29._12_4_ = -auVar61._0_4_;
      auVar29._16_4_ = -auVar61._0_4_;
      auVar29._20_4_ = -auVar61._0_4_;
      auVar29._24_4_ = -auVar61._0_4_;
      auVar29._28_4_ = -auVar61._0_4_;
      auVar30._4_4_ = local_24d8;
      auVar30._0_4_ = local_24d8;
      auVar30._8_4_ = local_24d8;
      auVar30._12_4_ = local_24d8;
      auVar30._16_4_ = local_24d8;
      auVar30._20_4_ = local_24d8;
      auVar30._24_4_ = local_24d8;
      auVar30._28_4_ = local_24d8;
      auVar100 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar50),auVar29,auVar30);
      auVar20._8_4_ = uVar42 ^ 0x80000000;
      auVar20._0_8_ = auVar75._0_8_ ^ 0x8000000080000000;
      auVar20._12_4_ = uVar16 ^ 0x80000000;
      auVar20._16_4_ = uVar42 ^ 0x80000000;
      auVar20._20_4_ = uVar16 ^ 0x80000000;
      auVar20._24_4_ = uVar42 ^ 0x80000000;
      auVar20._28_4_ = uVar16 ^ 0x80000000;
      auVar22._8_4_ = auVar8._0_4_;
      auVar22._0_8_ = uStack_2508;
      auVar22._12_4_ = fStack_2514;
      auVar22._16_8_ = uStack_2508;
      auVar22._24_8_ = uStack_2508;
      auVar62 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar55),auVar20,auVar22);
      auVar20 = vpmaxsd_avx2(ZEXT1632(auVar100),ZEXT1632(auVar62));
      auVar38._8_4_ = uVar13 ^ 0x80000000;
      auVar38._0_8_ = auVar9._0_8_ ^ 0x8000000080000000;
      auVar38._12_4_ = uVar17 ^ 0x80000000;
      auVar38._16_4_ = uVar13 ^ 0x80000000;
      auVar38._20_4_ = uVar17 ^ 0x80000000;
      auVar38._24_4_ = uVar13 ^ 0x80000000;
      auVar38._28_4_ = uVar17 ^ 0x80000000;
      auVar100 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + uVar56),auVar38,local_2398);
      auVar21._4_4_ = local_2558;
      auVar21._0_4_ = local_2558;
      auVar21._8_4_ = local_2558;
      auVar21._12_4_ = local_2558;
      auVar21._16_4_ = local_2558;
      auVar21._20_4_ = local_2558;
      auVar21._24_4_ = local_2558;
      auVar21._28_4_ = local_2558;
      auVar21 = vpmaxsd_avx2(ZEXT1632(auVar100),auVar21);
      auVar20 = vpmaxsd_avx2(auVar20,auVar21);
      uVar52 = CONCAT44(auVar90._0_4_,auVar90._0_4_);
      auVar36._8_4_ = -auVar90._0_4_;
      auVar36._0_8_ = uVar52 ^ 0x8000000080000000;
      auVar36._12_4_ = -auVar90._0_4_;
      auVar36._16_4_ = -auVar90._0_4_;
      auVar36._20_4_ = -auVar90._0_4_;
      auVar36._24_4_ = -auVar90._0_4_;
      auVar36._28_4_ = -auVar90._0_4_;
      auVar37._4_4_ = local_23d8;
      auVar37._0_4_ = local_23d8;
      auVar37._8_4_ = local_23d8;
      auVar37._12_4_ = local_23d8;
      auVar37._16_4_ = local_23d8;
      auVar37._20_4_ = local_23d8;
      auVar37._24_4_ = local_23d8;
      auVar37._28_4_ = local_23d8;
      auVar100 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar50 ^ 0x20)),auVar36,
                                 auVar37);
      auVar34._8_4_ = uVar14 ^ 0x80000000;
      auVar34._0_8_ = auVar59._0_8_ ^ 0x8000000080000000;
      auVar34._12_4_ = uVar18 ^ 0x80000000;
      auVar34._16_4_ = uVar14 ^ 0x80000000;
      auVar34._20_4_ = uVar18 ^ 0x80000000;
      auVar34._24_4_ = uVar14 ^ 0x80000000;
      auVar34._28_4_ = uVar18 ^ 0x80000000;
      auVar35._8_8_ = local_2418;
      auVar35._0_8_ = local_2418;
      auVar35._16_8_ = local_2418;
      auVar35._24_8_ = local_2418;
      auVar62 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar55 ^ 0x20)),auVar34,
                                auVar35);
      auVar21 = vpminsd_avx2(ZEXT1632(auVar100),ZEXT1632(auVar62));
      auVar32._8_4_ = uVar15 ^ 0x80000000;
      auVar32._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
      auVar32._12_4_ = uVar19 ^ 0x80000000;
      auVar32._16_4_ = uVar15 ^ 0x80000000;
      auVar32._20_4_ = uVar19 ^ 0x80000000;
      auVar32._24_4_ = uVar15 ^ 0x80000000;
      auVar32._28_4_ = uVar19 ^ 0x80000000;
      auVar33._8_8_ = local_2458;
      auVar33._0_8_ = local_2458;
      auVar33._16_8_ = local_2458;
      auVar33._24_8_ = local_2458;
      auVar100 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar46 + 0x40 + (uVar56 ^ 0x20)),auVar32,
                                 auVar33);
      auVar31._4_4_ = local_2498;
      auVar31._0_4_ = local_2498;
      auVar31._8_4_ = local_2498;
      auVar31._12_4_ = local_2498;
      auVar31._16_4_ = local_2498;
      auVar31._20_4_ = local_2498;
      auVar31._24_4_ = local_2498;
      auVar31._28_4_ = local_2498;
      auVar22 = vpminsd_avx2(ZEXT1632(auVar100),auVar31);
      auVar21 = vpminsd_avx2(auVar21,auVar22);
      auVar20 = vcmpps_avx(auVar20,auVar21,2);
      uVar44 = vmovmskps_avx(auVar20);
      puVar45 = puVar54;
      if (uVar44 == 0) break;
      uVar48 = (ulong)(uVar44 & 0xff);
      uVar52 = 8;
      uVar49 = 0;
      do {
        lVar53 = 0;
        for (uVar23 = uVar48; (uVar23 & 1) == 0; uVar23 = uVar23 >> 1 | 0x8000000000000000) {
          lVar53 = lVar53 + 1;
        }
        uVar43 = *(undefined4 *)(uVar46 + 0x40 + lVar53 * 4);
        auVar62._4_4_ = uVar43;
        auVar62._0_4_ = uVar43;
        auVar62._8_4_ = uVar43;
        auVar62._12_4_ = uVar43;
        auVar97 = vfmadd213ps_fma(auVar62,auVar85,auVar104);
        uVar43 = *(undefined4 *)(uVar46 + 0x80 + lVar53 * 4);
        auVar77._4_4_ = uVar43;
        auVar77._0_4_ = uVar43;
        auVar77._8_4_ = uVar43;
        auVar77._12_4_ = uVar43;
        auVar77 = vfmadd213ps_fma(auVar77,auVar7,auVar105);
        uVar43 = *(undefined4 *)(uVar46 + 0xc0 + lVar53 * 4);
        auVar80._4_4_ = uVar43;
        auVar80._0_4_ = uVar43;
        auVar80._8_4_ = uVar43;
        auVar80._12_4_ = uVar43;
        auVar80 = vfmadd213ps_fma(auVar80,auVar6,auVar58);
        uVar43 = *(undefined4 *)(uVar46 + 0x60 + lVar53 * 4);
        auVar87._4_4_ = uVar43;
        auVar87._0_4_ = uVar43;
        auVar87._8_4_ = uVar43;
        auVar87._12_4_ = uVar43;
        auVar87 = vfmadd213ps_fma(auVar87,auVar85,auVar104);
        uVar43 = *(undefined4 *)(uVar46 + 0xa0 + lVar53 * 4);
        auVar91._4_4_ = uVar43;
        auVar91._0_4_ = uVar43;
        auVar91._8_4_ = uVar43;
        auVar91._12_4_ = uVar43;
        auVar91 = vfmadd213ps_fma(auVar91,auVar7,auVar105);
        uVar43 = *(undefined4 *)(uVar46 + 0xe0 + lVar53 * 4);
        auVar94._4_4_ = uVar43;
        auVar94._0_4_ = uVar43;
        auVar94._8_4_ = uVar43;
        auVar94._12_4_ = uVar43;
        auVar94 = vfmadd213ps_fma(auVar94,auVar6,auVar58);
        auVar100 = vpminsd_avx(auVar97,auVar87);
        auVar62 = vpminsd_avx(auVar77,auVar91);
        auVar100 = vpmaxsd_avx(auVar100,auVar62);
        auVar62 = vpminsd_avx(auVar80,auVar94);
        auVar62 = vpmaxsd_avx(auVar62,auVar86);
        auVar100 = vpmaxsd_avx(auVar100,auVar62);
        auVar62 = vpmaxsd_avx(auVar97,auVar87);
        auVar97 = vpmaxsd_avx(auVar77,auVar91);
        auVar97 = vpminsd_avx(auVar62,auVar97);
        auVar62 = vpmaxsd_avx(auVar80,auVar94);
        auVar62 = vpminsd_avx(auVar62,local_2778);
        auVar62 = vpminsd_avx(auVar97,auVar62);
        auVar100 = vcmpps_avx(auVar100,auVar62,2);
        uVar44 = vmovmskps_avx(auVar100);
        if (uVar44 != 0) {
          uVar23 = *(ulong *)(uVar46 + lVar53 * 8);
          if (uVar52 != 8) {
            *puVar54 = uVar52;
            puVar54[1] = uVar49;
            puVar54 = puVar54 + 2;
          }
          uVar49 = (ulong)(uVar44 & 0xff);
          uVar52 = uVar23;
        }
        auVar89 = ZEXT1664(auVar60);
        uVar48 = uVar48 - 1 & uVar48;
      } while (uVar48 != 0);
      puVar45 = puVar54;
      if (uVar52 == 8) break;
      uVar46 = uVar52;
      if ((uVar52 & 8) != 0) {
        if (uVar49 == 0) goto LAB_005c0cd6;
        goto LAB_005c0886;
      }
    }
    if (puVar45 == local_2378) goto LAB_005c0cf5;
  }
  goto LAB_005c0cd6;
  while( true ) {
    uVar52 = uVar52 + 1;
    lVar53 = lVar53 + 0xb0;
    auVar81 = auVar77;
    if (uVar46 - 8 <= uVar52) break;
LAB_005c0938:
    uVar48 = 0;
    auVar97 = auVar81;
    while (uVar49 = (ulong)*(uint *)(lVar53 + uVar48 * 4), uVar49 != 0xffffffff) {
      uVar43 = *(undefined4 *)(lVar53 + -0x90 + uVar48 * 4);
      auVar63._4_4_ = uVar43;
      auVar63._0_4_ = uVar43;
      auVar63._8_4_ = uVar43;
      auVar63._12_4_ = uVar43;
      auVar77 = vsubps_avx(auVar63,*(undefined1 (*) [16])ray);
      uVar43 = *(undefined4 *)(lVar53 + -0x80 + uVar48 * 4);
      auVar64._4_4_ = uVar43;
      auVar64._0_4_ = uVar43;
      auVar64._8_4_ = uVar43;
      auVar64._12_4_ = uVar43;
      auVar80 = vsubps_avx(auVar64,*(undefined1 (*) [16])(ray + 0x10));
      uVar43 = *(undefined4 *)(lVar53 + -0x70 + uVar48 * 4);
      auVar65._4_4_ = uVar43;
      auVar65._0_4_ = uVar43;
      auVar65._8_4_ = uVar43;
      auVar65._12_4_ = uVar43;
      local_2628 = vsubps_avx(auVar65,*(undefined1 (*) [16])(ray + 0x20));
      fVar102 = *(float *)(lVar53 + -0x60 + uVar48 * 4);
      local_25e8._4_4_ = fVar102;
      local_25e8._0_4_ = fVar102;
      local_25e8._8_4_ = fVar102;
      local_25e8._12_4_ = fVar102;
      fVar103 = *(float *)(lVar53 + -0x50 + uVar48 * 4);
      local_25f8._4_4_ = fVar103;
      local_25f8._0_4_ = fVar103;
      local_25f8._8_4_ = fVar103;
      local_25f8._12_4_ = fVar103;
      fVar1 = *(float *)(lVar53 + -0x40 + uVar48 * 4);
      local_2608._4_4_ = fVar1;
      local_2608._0_4_ = fVar1;
      local_2608._8_4_ = fVar1;
      local_2608._12_4_ = fVar1;
      fVar2 = *(float *)(lVar53 + -0x30 + uVar48 * 4);
      local_2568._4_4_ = fVar2;
      local_2568._0_4_ = fVar2;
      local_2568._8_4_ = fVar2;
      local_2568._12_4_ = fVar2;
      fVar3 = *(float *)(lVar53 + -0x20 + uVar48 * 4);
      auVar78._4_4_ = fVar3;
      auVar78._0_4_ = fVar3;
      auVar78._8_4_ = fVar3;
      auVar78._12_4_ = fVar3;
      fVar4 = *(float *)(lVar53 + -0x10 + uVar48 * 4);
      local_2578._4_4_ = fVar4;
      local_2578._0_4_ = fVar4;
      local_2578._8_4_ = fVar4;
      local_2578._12_4_ = fVar4;
      fVar103 = fVar103 * fVar4;
      auVar66._4_4_ = fVar103;
      auVar66._0_4_ = fVar103;
      auVar66._8_4_ = fVar103;
      auVar66._12_4_ = fVar103;
      auVar94 = vfmsub231ps_fma(auVar66,auVar78,local_2608);
      fVar2 = fVar1 * fVar2;
      auVar67._4_4_ = fVar2;
      auVar67._0_4_ = fVar2;
      auVar67._8_4_ = fVar2;
      auVar67._12_4_ = fVar2;
      auVar72 = vfmsub231ps_fma(auVar67,local_2578,local_25e8);
      fVar102 = fVar102 * fVar3;
      auVar82._4_4_ = fVar102;
      auVar82._0_4_ = fVar102;
      auVar82._8_4_ = fVar102;
      auVar82._12_4_ = fVar102;
      local_2638 = vfmsub231ps_fma(auVar82,local_2568,local_25f8);
      auVar98._0_4_ = local_2628._0_4_ * local_26e8;
      auVar98._4_4_ = local_2628._4_4_ * fStack_26e4;
      auVar98._8_4_ = local_2628._8_4_ * fStack_26e0;
      auVar98._12_4_ = local_2628._12_4_ * fStack_26dc;
      auVar63 = vfmsub231ps_fma(auVar98,auVar80,*(undefined1 (*) [16])(ray + 0x60));
      fVar102 = (float)((ulong)local_25b8 >> 0x20);
      fVar103 = (float)((ulong)uStack_25b0 >> 0x20);
      local_27d8._4_4_ = fVar102 * auVar77._4_4_;
      local_27d8._0_4_ = (float)local_25b8 * auVar77._0_4_;
      fStack_27d0 = (float)uStack_25b0 * auVar77._8_4_;
      fStack_27cc = fVar103 * auVar77._12_4_;
      auVar64 = vfmsub231ps_fma(_local_27d8,local_2628,auVar62);
      auVar68._0_4_ = (float)local_25c8 * auVar80._0_4_;
      auVar68._4_4_ = (float)((ulong)local_25c8 >> 0x20) * auVar80._4_4_;
      auVar68._8_4_ = (float)uStack_25c0 * auVar80._8_4_;
      auVar68._12_4_ = (float)((ulong)uStack_25c0 >> 0x20) * auVar80._12_4_;
      auVar96._12_4_ = fStack_26dc;
      auVar96._0_12_ = *(undefined1 (*) [12])(ray + 0x50);
      auVar65 = vfmsub231ps_fma(auVar68,auVar77,auVar96);
      auVar101._0_4_ = (float)local_25b8 * local_2638._0_4_;
      auVar101._4_4_ = fVar102 * local_2638._4_4_;
      auVar101._8_4_ = (float)uStack_25b0 * local_2638._8_4_;
      auVar101._12_4_ = fVar103 * local_2638._12_4_;
      auVar100 = vfmadd231ps_fma(auVar101,auVar96,auVar72);
      auVar91 = vfmadd231ps_fma(auVar100,auVar62,auVar94);
      auVar95._0_4_ = auVar65._0_4_ * fVar4;
      auVar95._4_4_ = auVar65._4_4_ * fVar4;
      auVar95._8_4_ = auVar65._8_4_ * fVar4;
      auVar95._12_4_ = auVar65._12_4_ * fVar4;
      auVar87 = vfmadd231ps_fma(auVar95,auVar64,auVar78);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar100 = vandps_avx(auVar91,auVar28);
      auVar87 = vfmadd231ps_fma(auVar87,auVar63,local_2568);
      uVar44 = auVar100._0_4_;
      auVar99._0_4_ = auVar87._0_4_ ^ uVar44;
      uVar10 = auVar100._4_4_;
      auVar99._4_4_ = auVar87._4_4_ ^ uVar10;
      uVar11 = auVar100._8_4_;
      auVar99._8_4_ = auVar87._8_4_ ^ uVar11;
      uVar12 = auVar100._12_4_;
      auVar99._12_4_ = auVar87._12_4_ ^ uVar12;
      auVar96 = ZEXT816(0) << 0x20;
      auVar100 = vcmpps_avx(auVar99,auVar96,5);
      auVar87 = auVar97 & auVar100;
      auVar92._8_8_ = mm_lookupmask_ps._8_8_;
      auVar92._0_8_ = mm_lookupmask_ps._0_8_;
      if ((((auVar87 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar87 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar87 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar87[0xf] < '\0'
         ) {
        auVar100 = vandps_avx(auVar100,auVar97);
        auVar70._0_4_ = auVar65._0_4_ * fVar1;
        auVar70._4_4_ = auVar65._4_4_ * fVar1;
        auVar70._8_4_ = auVar65._8_4_ * fVar1;
        auVar70._12_4_ = auVar65._12_4_ * fVar1;
        auVar87 = vfmadd132ps_fma(auVar64,auVar70,local_25f8);
        auVar87 = vfmadd132ps_fma(auVar63,auVar87,local_25e8);
        auVar79._0_4_ = uVar44 ^ auVar87._0_4_;
        auVar79._4_4_ = uVar10 ^ auVar87._4_4_;
        auVar79._8_4_ = uVar11 ^ auVar87._8_4_;
        auVar79._12_4_ = uVar12 ^ auVar87._12_4_;
        auVar87 = vcmpps_avx(auVar79,auVar96,5);
        auVar63 = auVar100 & auVar87;
        if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar63[0xf] < '\0') {
          auVar63 = vandps_avx(auVar91,local_26c8);
          auVar100 = vandps_avx(auVar87,auVar100);
          auVar87 = vsubps_avx(auVar63,auVar99);
          auVar87 = vcmpps_avx(auVar87,auVar79,5);
          auVar64 = auVar100 & auVar87;
          if ((((auVar64 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar64 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar64 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar64[0xf] < '\0') {
            auVar100 = vandps_avx(auVar87,auVar100);
            auVar83._0_4_ = local_2638._0_4_ * local_2628._0_4_;
            auVar83._4_4_ = local_2638._4_4_ * local_2628._4_4_;
            auVar83._8_4_ = local_2638._8_4_ * local_2628._8_4_;
            auVar83._12_4_ = local_2638._12_4_ * local_2628._12_4_;
            auVar80 = vfmadd132ps_fma(auVar80,auVar83,auVar72);
            auVar77 = vfmadd213ps_fma(auVar77,auVar94,auVar80);
            auVar84._0_4_ = auVar77._0_4_ ^ uVar44;
            auVar84._4_4_ = auVar77._4_4_ ^ uVar10;
            auVar84._8_4_ = auVar77._8_4_ ^ uVar11;
            auVar84._12_4_ = auVar77._12_4_ ^ uVar12;
            local_2648._0_4_ = (float)uVar24;
            local_2648._4_4_ = (float)((ulong)uVar24 >> 0x20);
            uStack_2640._0_4_ = (float)uVar25;
            uStack_2640._4_4_ = (float)((ulong)uVar25 >> 0x20);
            auVar88._0_4_ = auVar63._0_4_ * (float)local_2648;
            auVar88._4_4_ = auVar63._4_4_ * local_2648._4_4_;
            auVar88._8_4_ = auVar63._8_4_ * (float)uStack_2640;
            auVar88._12_4_ = auVar63._12_4_ * uStack_2640._4_4_;
            auVar77 = vcmpps_avx(auVar88,auVar84,1);
            local_2658._0_4_ = (float)uVar26;
            local_2658._4_4_ = (float)((ulong)uVar26 >> 0x20);
            uStack_2650._0_4_ = (float)uVar27;
            uStack_2650._4_4_ = (float)((ulong)uVar27 >> 0x20);
            auVar71._0_4_ = auVar63._0_4_ * (float)local_2658;
            auVar71._4_4_ = auVar63._4_4_ * local_2658._4_4_;
            auVar71._8_4_ = auVar63._8_4_ * (float)uStack_2650;
            auVar71._12_4_ = auVar63._12_4_ * uStack_2650._4_4_;
            auVar80 = vcmpps_avx(auVar84,auVar71,2);
            auVar77 = vandps_avx(auVar80,auVar77);
            auVar80 = auVar100 & auVar77;
            if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar80[0xf] < '\0') {
              auVar100 = vandps_avx(auVar77,auVar100);
              auVar77 = vcmpps_avx(auVar91,auVar96,4);
              auVar80 = auVar100 & auVar77;
              if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar80 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar80 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar80[0xf]) {
              }
              else {
                auVar92 = vandps_avx(auVar77,auVar100);
              }
            }
          }
        }
      }
      uVar44 = ((context->scene->geometries).items[uVar49].ptr)->mask;
      auVar69._4_4_ = uVar44;
      auVar69._0_4_ = uVar44;
      auVar69._8_4_ = uVar44;
      auVar69._12_4_ = uVar44;
      auVar100 = vpand_avx(auVar69,*(undefined1 (*) [16])(ray + 0x90));
      auVar100 = vpcmpeqd_avx(auVar96,auVar100);
      auVar77 = auVar92 & ~auVar100;
      if ((((auVar77 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar77 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar77 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar77[0xf] < '\0'
         ) {
        auVar100 = vandnps_avx(auVar100,auVar92);
        auVar97 = vandnps_avx(auVar100,auVar97);
      }
      auVar89 = ZEXT1664(auVar60);
      if (((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar97[0xf])
         || (bVar57 = 2 < uVar48, uVar48 = uVar48 + 1, bVar57)) break;
    }
    auVar100 = auVar89._0_16_;
    auVar77 = vandps_avx(auVar81,auVar97);
    auVar97 = auVar97 & auVar81;
    if ((((auVar97 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar97 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar97 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar97[0xf])
    break;
  }
  auVar72._0_8_ = auVar77._0_8_ ^ 0xffffffffffffffff;
  auVar72._8_4_ = auVar77._8_4_ ^ 0xffffffff;
  auVar72._12_4_ = auVar77._12_4_ ^ 0xffffffff;
LAB_005c0ca6:
  auVar60 = vorps_avx(auVar100,auVar72);
  auVar89 = ZEXT1664(auVar60);
  auVar100 = auVar76 & ~auVar60;
  pRVar47 = context;
  if ((((auVar100 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar100 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar100 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar100[0xf])
  goto LAB_005c0cf5;
  auVar76 = vandnps_avx(auVar60,auVar76);
  auVar73._8_4_ = 0xff800000;
  auVar73._0_8_ = 0xff800000ff800000;
  auVar73._12_4_ = 0xff800000;
  local_2778 = vblendvps_avx(local_2778,auVar73,auVar60);
LAB_005c0cd6:
  uVar43 = vmovmskps_avx(auVar89._0_16_);
  pRVar47 = (RayQueryContext *)CONCAT44((int)((ulong)pRVar47 >> 0x20),uVar43);
  puVar45 = puVar54;
  if (puVar54 == local_2378) goto LAB_005c0cf5;
  goto LAB_005c0658;
LAB_005c0cf5:
  if (uVar51 == 0) {
    auVar58 = vpcmpeqd_avx(auVar58,auVar58);
    auVar58 = vpcmpeqd_avx(auVar58,(undefined1  [16])local_26b8);
    auVar58 = vpand_avx(auVar58,auVar89._0_16_);
    auVar74._8_4_ = 0xff800000;
    auVar74._0_8_ = 0xff800000ff800000;
    auVar74._12_4_ = 0xff800000;
    auVar58 = vmaskmovps_avx(auVar58,auVar74);
    *(undefined1 (*) [16])(ray + 0x80) = auVar58;
    return;
  }
  goto LAB_005c0254;
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }